

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

int stbtt__GetGlyfOffset(stbtt_fontinfo *info,int glyph_index)

{
  stbtt_uint16 sVar1;
  stbtt_uint32 sVar2;
  int in_ESI;
  long in_RDI;
  int g2;
  int g1;
  undefined4 local_30;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_4;
  
  if (in_ESI < *(int *)(in_RDI + 0x14)) {
    if (*(int *)(in_RDI + 0x3c) < 2) {
      if (*(int *)(in_RDI + 0x3c) == 0) {
        local_18 = *(int *)(in_RDI + 0x20);
        sVar1 = ttUSHORT((stbtt_uint8 *)
                         (*(long *)(in_RDI + 8) + (long)*(int *)(in_RDI + 0x18) +
                         (long)(in_ESI << 1)));
        local_18 = local_18 + (uint)sVar1 * 2;
        local_1c = *(int *)(in_RDI + 0x20);
        sVar1 = ttUSHORT((stbtt_uint8 *)
                         (*(long *)(in_RDI + 8) + (long)*(int *)(in_RDI + 0x18) +
                          (long)(in_ESI << 1) + 2));
        local_1c = local_1c + (uint)sVar1 * 2;
      }
      else {
        local_18 = *(int *)(in_RDI + 0x20);
        sVar2 = ttULONG((stbtt_uint8 *)
                        (*(long *)(in_RDI + 8) + (long)*(int *)(in_RDI + 0x18) + (long)(in_ESI << 2)
                        ));
        local_18 = local_18 + sVar2;
        local_1c = *(int *)(in_RDI + 0x20);
        sVar2 = ttULONG((stbtt_uint8 *)
                        (*(long *)(in_RDI + 8) + (long)*(int *)(in_RDI + 0x18) + (long)(in_ESI << 2)
                        + 4));
        local_1c = local_1c + sVar2;
      }
      if (local_18 == local_1c) {
        local_30 = -1;
      }
      else {
        local_30 = local_18;
      }
      local_4 = local_30;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int stbtt__GetGlyfOffset(const stbtt_fontinfo *info, int glyph_index)
{
   int g1,g2;

   STBTT_assert(!info->cff.size);

   if (glyph_index >= info->numGlyphs) return -1; // glyph index out of range
   if (info->indexToLocFormat >= 2)    return -1; // unknown index->glyph map format

   if (info->indexToLocFormat == 0) {
      g1 = info->glyf + ttUSHORT(info->data + info->loca + glyph_index * 2) * 2;
      g2 = info->glyf + ttUSHORT(info->data + info->loca + glyph_index * 2 + 2) * 2;
   } else {
      g1 = info->glyf + ttULONG (info->data + info->loca + glyph_index * 4);
      g2 = info->glyf + ttULONG (info->data + info->loca + glyph_index * 4 + 4);
   }

   return g1==g2 ? -1 : g1; // if length is 0, return -1
}